

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O0

subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
* __thiscall
burst::make_subset_iterator<boost::integer_range<int>>
          (subset_iterator<boost::range_detail::integer_iterator<int>,_std::less<void>,_std::vector<boost::range_detail::integer_iterator<int>,_std::allocator<boost::range_detail::integer_iterator<int>_>_>_>
           *__return_storage_ptr__,burst *this,integer_range<int> *range)

{
  integer_iterator<int> iVar1;
  integer_iterator<int> first;
  integer_iterator<int> in_ECX;
  integer_range<int> *range_local;
  
  iVar1 = std::begin<boost::integer_range<int>>((integer_range<int> *)this);
  first = std::end<boost::integer_range<int>>((integer_range<int> *)this);
  make_subset_iterator<boost::range_detail::integer_iterator<int>>
            (__return_storage_ptr__,(burst *)(ulong)(uint)iVar1.m_value,first,in_ECX);
  return __return_storage_ptr__;
}

Assistant:

auto make_subset_iterator (ForwardRange && range)
    {
        using std::begin;
        using std::end;
        return
            make_subset_iterator
            (
                begin(std::forward<ForwardRange>(range)),
                end(std::forward<ForwardRange>(range))
            );
    }